

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O2

void __thiscall
qclab::qgates::QGate2<float>::apply
          (QGate2<float> *this,Side side,Op op,int nbQubits,SquareMatrix<float> *matrix,int offset)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  byte bVar5;
  uint __line;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  long lVar9;
  float *pfVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  float *pfVar14;
  char *__assertion;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  bool bVar28;
  SquareMatrix<float> mat2;
  SquareMatrix<float> local_68;
  SquareMatrix<float> local_58;
  vector<int,_std::allocator<int>_> qubits;
  
  if (nbQubits < 2) {
    __assertion = "nbQubits >= 2";
    __line = 0x23;
  }
  else {
    bVar8 = (byte)nbQubits;
    if (matrix->size_ == (long)(1 << (bVar8 & 0x1f))) {
      (*(this->super_QObject<float>)._vptr_QObject[5])(&qubits,this);
      iVar6 = *qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + offset;
      *qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = iVar6;
      iVar21 = offset + qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[1];
      qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [1] = iVar21;
      if (iVar6 < nbQubits) {
        if (iVar21 < nbQubits) {
          if (iVar6 + 1 == iVar21) {
            (*(this->super_QObject<float>)._vptr_QObject[7])(&mat2,this);
            dense::operateInPlace<qclab::dense::SquareMatrix<float>>(op,&mat2);
            if (side == Left) {
              if (nbQubits == 2) {
                dense::SquareMatrix<float>::operator*=(matrix,&mat2);
              }
              else {
                bVar5 = (byte)*qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start & 0x1f;
                lVar19 = (long)(1 << (~(byte)qubits.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start[1] + bVar8 &
                                     0x1f));
                uVar12 = 0;
                lVar24 = 0;
                if (0 < lVar19) {
                  lVar24 = lVar19;
                }
                lVar18 = matrix->size_;
                uVar7 = (ulong)(uint)(1 << bVar5);
                if (1 << bVar5 < 1) {
                  uVar7 = uVar12;
                }
                lVar27 = 0;
                if (0 < lVar18) {
                  lVar27 = lVar18;
                }
                lVar19 = lVar19 * lVar18;
                lVar16 = lVar19 * 0x10;
                lVar23 = lVar19 * 4;
                lVar25 = lVar19 * 0xc;
                lVar19 = lVar19 * 8;
                for (lVar9 = 0; lVar9 != lVar27; lVar9 = lVar9 + 1) {
                  uVar11 = uVar12;
                  lVar20 = lVar19;
                  lVar22 = lVar23;
                  lVar26 = lVar25;
                  for (uVar15 = 0; uVar15 != uVar7; uVar15 = uVar15 + 1) {
                    pfVar10 = (matrix->data_)._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl;
                    lVar17 = mat2.size_ * 0xc;
                    pfVar14 = (float *)((long)pfVar10 + uVar11);
                    lVar13 = lVar24;
                    while (bVar28 = lVar13 != 0, lVar13 = lVar13 + -1, bVar28) {
                      fVar1 = *pfVar14;
                      fVar2 = *(float *)((long)pfVar10 + lVar22);
                      fVar3 = *(float *)((long)pfVar10 + lVar20);
                      fVar4 = *(float *)((long)pfVar10 + lVar26);
                      *pfVar14 = *(float *)((long)mat2.data_._M_t.
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + 0xc) * fVar4 +
                                 *(float *)((long)mat2.data_._M_t.
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + 8) * fVar3 +
                                 *(float *)mat2.data_._M_t.
                                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                           .super__Head_base<0UL,_float_*,_false>._M_head_impl *
                                 fVar1 + *(float *)((long)mat2.data_._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + 4) * fVar2;
                      *(float *)((long)pfVar10 + lVar22) =
                           *(float *)((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                            .super__Head_base<0UL,_float_*,_false>._M_head_impl +
                                      0xc + mat2.size_ * 4) * fVar4 +
                           *(float *)((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                            .super__Head_base<0UL,_float_*,_false>._M_head_impl + 8
                                     + mat2.size_ * 4) * fVar3 +
                           *(float *)((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                            .super__Head_base<0UL,_float_*,_false>._M_head_impl +
                                     mat2.size_ * 4) * fVar1 +
                           *(float *)((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                            .super__Head_base<0UL,_float_*,_false>._M_head_impl + 4
                                     + mat2.size_ * 4) * fVar2;
                      *(float *)((long)pfVar10 + lVar20) =
                           *(float *)((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                            .super__Head_base<0UL,_float_*,_false>._M_head_impl +
                                      0xc + mat2.size_ * 8) * fVar4 +
                           *(float *)((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                            .super__Head_base<0UL,_float_*,_false>._M_head_impl + 8
                                     + mat2.size_ * 8) * fVar3 +
                           *(float *)((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                            .super__Head_base<0UL,_float_*,_false>._M_head_impl +
                                     mat2.size_ * 8) * fVar1 +
                           *(float *)((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                            .super__Head_base<0UL,_float_*,_false>._M_head_impl + 4
                                     + mat2.size_ * 8) * fVar2;
                      *(float *)((long)pfVar10 + lVar26) =
                           fVar4 * *(float *)((long)mat2.data_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + 0xc + lVar17) +
                           fVar3 * *(float *)((long)mat2.data_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + 8 + lVar17) +
                           fVar1 * *(float *)((long)mat2.data_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + lVar17) +
                           fVar2 * *(float *)((long)mat2.data_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + 4 + lVar17);
                      pfVar14 = pfVar14 + lVar18;
                      pfVar10 = pfVar10 + lVar18;
                    }
                    uVar11 = uVar11 + lVar16;
                    lVar22 = lVar22 + lVar16;
                    lVar20 = lVar20 + lVar16;
                    lVar26 = lVar26 + lVar16;
                  }
                  uVar12 = uVar12 + 4;
                  lVar23 = lVar23 + 4;
                  lVar19 = lVar19 + 4;
                  lVar25 = lVar25 + 4;
                }
              }
            }
            else if (nbQubits == 2) {
              dense::SquareMatrix<float>::SquareMatrix(&local_68,&mat2);
              dense::operator*((dense *)&local_58,&local_68,matrix);
              dense::SquareMatrix<float>::operator=(matrix,&local_58);
              std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&local_58.data_);
              std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&local_68.data_);
            }
            else {
              bVar5 = (byte)*qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start & 0x1f;
              lVar27 = (long)(1 << (~(byte)qubits.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start[1] + bVar8 &
                                   0x1f));
              lVar19 = matrix->size_;
              lVar24 = lVar27 * 4;
              uVar12 = 0;
              lVar18 = 0;
              if (0 < lVar27) {
                lVar18 = lVar27;
              }
              uVar7 = (ulong)(uint)(1 << bVar5);
              if (1 << bVar5 < 1) {
                uVar7 = uVar12;
              }
              lVar23 = 0;
              if (0 < lVar19) {
                lVar23 = lVar19;
              }
              lVar19 = lVar19 * 4;
              lVar9 = lVar27 * 0x10;
              lVar16 = lVar27 * 0xc;
              lVar27 = lVar27 << 3;
              for (lVar25 = 0; lVar25 != lVar23; lVar25 = lVar25 + 1) {
                uVar11 = uVar12;
                lVar20 = lVar16;
                lVar22 = lVar24;
                lVar26 = lVar27;
                for (uVar15 = 0; uVar15 != uVar7; uVar15 = uVar15 + 1) {
                  pfVar14 = (matrix->data_)._M_t.
                            super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                            super__Head_base<0UL,_float_*,_false>._M_head_impl;
                  lVar17 = mat2.size_ * 0xc;
                  lVar13 = lVar18;
                  while (bVar28 = lVar13 != 0, lVar13 = lVar13 + -1, bVar28) {
                    fVar1 = *(float *)((long)pfVar14 + uVar11);
                    fVar2 = *(float *)((long)pfVar14 + lVar22);
                    fVar3 = *(float *)((long)pfVar14 + lVar26);
                    fVar4 = *(float *)((long)pfVar14 + lVar20);
                    *(float *)((long)pfVar14 + uVar11) =
                         *(float *)((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                          .super__Head_base<0UL,_float_*,_false>._M_head_impl +
                                   lVar17) * fVar4 +
                         *(float *)((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                          .super__Head_base<0UL,_float_*,_false>._M_head_impl +
                                   mat2.size_ * 8) * fVar3 +
                         *(float *)mat2.data_._M_t.
                                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                   super__Head_base<0UL,_float_*,_false>._M_head_impl * fVar1 +
                         *(float *)((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                          .super__Head_base<0UL,_float_*,_false>._M_head_impl +
                                   mat2.size_ * 4) * fVar2;
                    *(float *)((long)pfVar14 + lVar22) =
                         *(float *)((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                          .super__Head_base<0UL,_float_*,_false>._M_head_impl + 4 +
                                   lVar17) * fVar4 +
                         *(float *)((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                          .super__Head_base<0UL,_float_*,_false>._M_head_impl + 4 +
                                   mat2.size_ * 8) * fVar3 +
                         *(float *)((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                          .super__Head_base<0UL,_float_*,_false>._M_head_impl + 4) *
                         fVar1 + *(float *)((long)mat2.data_._M_t.
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + 4 + mat2.size_ * 4) * fVar2;
                    *(float *)((long)pfVar14 + lVar26) =
                         *(float *)((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                          .super__Head_base<0UL,_float_*,_false>._M_head_impl + 8 +
                                   lVar17) * fVar4 +
                         *(float *)((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                          .super__Head_base<0UL,_float_*,_false>._M_head_impl + 8 +
                                   mat2.size_ * 8) * fVar3 +
                         *(float *)((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                          .super__Head_base<0UL,_float_*,_false>._M_head_impl + 8) *
                         fVar1 + *(float *)((long)mat2.data_._M_t.
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + 8 + mat2.size_ * 4) * fVar2;
                    *(float *)((long)pfVar14 + lVar20) =
                         fVar4 * *(float *)((long)mat2.data_._M_t.
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + 0xc + lVar17) +
                         fVar3 * *(float *)((long)mat2.data_._M_t.
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + 0xc + mat2.size_ * 8) +
                         fVar1 * *(float *)((long)mat2.data_._M_t.
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + 0xc) +
                         fVar2 * *(float *)((long)mat2.data_._M_t.
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + 0xc + mat2.size_ * 4);
                    pfVar14 = pfVar14 + 1;
                  }
                  uVar11 = uVar11 + lVar9;
                  lVar22 = lVar22 + lVar9;
                  lVar20 = lVar20 + lVar9;
                  lVar26 = lVar26 + lVar9;
                }
                uVar12 = uVar12 + lVar19;
                lVar24 = lVar24 + lVar19;
                lVar16 = lVar16 + lVar19;
                lVar27 = lVar27 + lVar19;
              }
            }
            std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&mat2.data_);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&qubits.super__Vector_base<int,_std::allocator<int>_>);
            return;
          }
          __assertion = "qubits[0] + 1 == qubits[1]";
          __line = 0x29;
          goto LAB_0038d9f0;
        }
        __assertion = "qubits[1] < nbQubits";
      }
      else {
        __assertion = "qubits[0] < nbQubits";
      }
      __line = 0x28;
    }
    else {
      __assertion = "matrix.size() == 1 << nbQubits";
      __line = 0x24;
    }
  }
LAB_0038d9f0:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/src/qgates/QGate2.cpp"
                ,__line,
                "virtual void qclab::qgates::QGate2<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
               );
}

Assistant:

void QGate2< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    assert( qubits[0] + 1 == qubits[1] ) ;  // nearest neighbor qubtis
    // operation
    qclab::dense::SquareMatrix< T >  mat2 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat2 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 2 ) {
        matrix *= mat2 ;
      } else {
        // matrix *= kron( Ileft , mat2 , Iright )
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 4 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const int64_t j3 = j2 + nRight ;
              const int64_t j4 = j3 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              const T x3 = matrix(i,j3) ;
              const T x4 = matrix(i,j4) ;
              matrix(i,j1) = mat2(0,0) * x1 + mat2(1,0) * x2 +
                             mat2(2,0) * x3 + mat2(3,0) * x4 ;
              matrix(i,j2) = mat2(0,1) * x1 + mat2(1,1) * x2 +
                             mat2(2,1) * x3 + mat2(3,1) * x4 ;
              matrix(i,j3) = mat2(0,2) * x1 + mat2(1,2) * x2 +
                             mat2(2,2) * x3 + mat2(3,2) * x4 ;
              matrix(i,j4) = mat2(0,3) * x1 + mat2(1,3) * x2 +
                             mat2(2,3) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 2 ) {
        matrix = mat2 * matrix ;
      } else {
        // matrix = kron( Ileft , mat2 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 4 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const int64_t i3 = i2 + nRight ;
              const int64_t i4 = i3 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              const T x3 = matrix(i3,j) ;
              const T x4 = matrix(i4,j) ;
              matrix(i1,j) = mat2(0,0) * x1 + mat2(0,1) * x2 +
                             mat2(0,2) * x3 + mat2(0,3) * x4 ;
              matrix(i2,j) = mat2(1,0) * x1 + mat2(1,1) * x2 +
                             mat2(1,2) * x3 + mat2(1,3) * x4 ;
              matrix(i3,j) = mat2(2,0) * x1 + mat2(2,1) * x2 +
                             mat2(2,2) * x3 + mat2(2,3) * x4 ;
              matrix(i4,j) = mat2(3,0) * x1 + mat2(3,1) * x2 +
                             mat2(3,2) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    }
  }